

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_cs.c
# Opt level: O1

int cupdlp_dcs_sprealloc(cupdlp_dcs *A,int nzmax)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  double *pdVar4;
  byte bVar5;
  ulong uVar6;
  double *__ptr;
  bool bVar7;
  bool bVar8;
  
  if (A == (cupdlp_dcs *)0x0) {
    bVar5 = 0;
  }
  else {
    if (nzmax < 1) {
      if (A->nz == -1) {
        piVar1 = A->p + A->n;
      }
      else {
        piVar1 = &A->nz;
      }
      nzmax = *piVar1;
    }
    uVar6 = 1;
    if (1 < nzmax) {
      uVar6 = (ulong)(uint)nzmax;
    }
    piVar1 = A->i;
    piVar2 = (int *)realloc(piVar1,uVar6 * 4);
    if (piVar2 != (int *)0x0) {
      piVar1 = piVar2;
    }
    A->i = piVar1;
    bVar7 = true;
    if (-1 < A->nz) {
      piVar1 = A->p;
      piVar3 = (int *)realloc(piVar1,uVar6 * 4);
      bVar7 = piVar3 != (int *)0x0;
      if (bVar7) {
        piVar1 = piVar3;
      }
      A->p = piVar1;
    }
    bVar8 = true;
    __ptr = A->x;
    if (__ptr != (double *)0x0) {
      pdVar4 = (double *)realloc(__ptr,uVar6 * 8);
      bVar8 = pdVar4 != (double *)0x0;
      if (bVar8) {
        __ptr = pdVar4;
      }
      A->x = __ptr;
    }
    bVar5 = bVar7 & bVar8 & piVar2 != (int *)0x0;
    if (bVar5 == 1) {
      A->nzmax = (int)uVar6;
    }
  }
  return (int)bVar5;
}

Assistant:

int cupdlp_dcs_sprealloc(cupdlp_dcs *A, int nzmax) {
  int ok, oki, okj = 1, okx = 1;
  if (!A) return (0);
  if (nzmax <= 0) nzmax = IS_CSC(A) ? (A->p[A->n]) : A->nz;
  nzmax = MAX(nzmax, 1);
  A->i = cupdlp_dcs_realloc(A->i, nzmax, sizeof(int), &oki);
  if (IS_TRIPLET(A)) A->p = cupdlp_dcs_realloc(A->p, nzmax, sizeof(int), &okj);
  if (A->x) A->x = cupdlp_dcs_realloc(A->x, nzmax, sizeof(double), &okx);
  ok = (oki && okj && okx);
  if (ok) A->nzmax = nzmax;
  return (ok);
}